

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crash.c
# Opt level: O0

void test_pool(void)

{
  int iVar1;
  ulong uVar2;
  tp_task_t *ptVar3;
  undefined8 local_148;
  tp_task_t *tasks [10];
  undefined1 local_f0 [8];
  thread_pool_t tp;
  int a [10];
  int i;
  
  memset((void *)((long)&tp.no_task + 0x28),0,0x28);
  uVar2 = tp_init(local_f0,0x14);
  if ((uVar2 & 1) == 0) {
    __assert_fail("tp_init(&tp, 20)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_crash.c"
                  ,0x29,"void test_pool()");
  }
  uVar2 = tp_start(local_f0);
  if ((uVar2 & 1) == 0) {
    __assert_fail("tp_start(&tp)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_crash.c"
                  ,0x2a,"void test_pool()");
  }
  for (a[9] = 0; a[9] < 10; a[9] = a[9] + 1) {
    ptVar3 = (tp_task_t *)tp_task_create(task1,cleanup1,0);
    tasks[(long)a[9] + -1] = ptVar3;
  }
  iVar1 = tp_post_tasks(local_f0,&local_148,10);
  if (iVar1 == 10) {
    tp_join_tasks(local_f0);
    tp_destroy(local_f0);
    return;
  }
  __assert_fail("LEN == tp_post_tasks(&tp, tasks, LEN)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/WqyJh[P]thread_pool/test/test_crash.c"
                ,0x31,"void test_pool()");
}

Assistant:

void test_pool()
{
    int i;
    int a[LEN];
    thread_pool_t tp;
    tp_task_t *tasks[LEN];

    bzero(a, sizeof(int) * LEN);

    assert(tp_init(&tp, 20));
    assert(tp_start(&tp));


    for (i = 0; i < LEN; ++i) {
        tasks[i] = tp_task_create(task1, cleanup1, NULL, 0);
    }

    assert(LEN == tp_post_tasks(&tp, tasks, LEN));

    tp_join_tasks(&tp);
    tp_destroy(&tp);
}